

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

bool __thiscall ftxui::Component::Focused(Component *this)

{
  Component *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  bool bVar3;
  Component *parent;
  Component *current;
  Component *this_local;
  
  parent = this;
  do {
    pCVar1 = parent->parent_;
    if (pCVar1 == (Component *)0x0) {
      return true;
    }
    iVar2 = (*pCVar1->_vptr_Component[4])();
    bVar3 = (Component *)CONCAT44(extraout_var,iVar2) == parent;
    parent = pCVar1;
  } while (bVar3);
  return false;
}

Assistant:

bool Component::Focused() {
  Component* current = this;
  for (;;) {
    Component* parent = current->parent_;
    if (!parent)
      return true;
    if (parent->ActiveChild() != current)
      return false;
    current = parent;
  }
}